

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall google::protobuf::EnumDescriptorProto::IsInitialized(EnumDescriptorProto *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  EnumOptions *pEVar5;
  long lVar6;
  
  iVar3 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
  bVar2 = 0 < iVar3;
  if (iVar3 < 1) {
LAB_001957f9:
    if ((this->_has_bits_[0] & 4) != 0) {
      pEVar5 = this->options_;
      if (pEVar5 == (EnumOptions *)0x0) {
        pEVar5 = *(EnumOptions **)(default_instance_ + 0x30);
      }
      iVar3 = (*(pEVar5->super_Message).super_MessageLite._vptr_MessageLite[5])();
      if ((char)iVar3 == '\0') goto LAB_00195824;
    }
    bVar2 = true;
  }
  else {
    cVar1 = (**(code **)(**(this->value_).super_RepeatedPtrFieldBase.elements_ + 0x28))();
    if (cVar1 != '\0') {
      lVar6 = 1;
      do {
        lVar4 = (long)(this->value_).super_RepeatedPtrFieldBase.current_size_;
        bVar2 = lVar6 < lVar4;
        if (lVar4 <= lVar6) goto LAB_001957f9;
        cVar1 = (**(code **)(*(this->value_).super_RepeatedPtrFieldBase.elements_[lVar6] + 0x28))();
        lVar6 = lVar6 + 1;
      } while (cVar1 != '\0');
    }
    if (!bVar2) goto LAB_001957f9;
LAB_00195824:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool EnumDescriptorProto::IsInitialized() const {

  for (int i = 0; i < value_size(); i++) {
    if (!this->value(i).IsInitialized()) return false;
  }
  if (has_options()) {
    if (!this->options().IsInitialized()) return false;
  }
  return true;
}